

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

void sam_hdr_free(SAM_hdr *hdr)

{
  int iVar1;
  char *pcVar2;
  int local_1c;
  int local_18;
  int i_2;
  int i_1;
  int i;
  SAM_hdr *hdr_local;
  
  if ((hdr != (SAM_hdr *)0x0) && (iVar1 = hdr->ref_count + -1, hdr->ref_count = iVar1, iVar1 < 1)) {
    pcVar2 = ks_str(&hdr->text);
    if ((pcVar2 != (char *)0x0) && ((hdr->text).s != (char *)0x0)) {
      free((hdr->text).s);
    }
    if (hdr->h != (kh_sam_hdr_t *)0x0) {
      kh_destroy_sam_hdr(hdr->h);
    }
    if (hdr->ref_hash != (kh_m_s2i_t *)0x0) {
      kh_destroy_m_s2i(hdr->ref_hash);
    }
    if (hdr->ref != (SAM_SQ *)0x0) {
      for (i_2 = 0; i_2 < hdr->nref; i_2 = i_2 + 1) {
        if (hdr->ref[i_2].name != (char *)0x0) {
          free(hdr->ref[i_2].name);
        }
      }
      free(hdr->ref);
    }
    if (hdr->rg_hash != (kh_m_s2i_t *)0x0) {
      kh_destroy_m_s2i(hdr->rg_hash);
    }
    if (hdr->rg != (SAM_RG *)0x0) {
      for (local_18 = 0; local_18 < hdr->nrg; local_18 = local_18 + 1) {
        if (hdr->rg[local_18].name != (char *)0x0) {
          free(hdr->rg[local_18].name);
        }
      }
      free(hdr->rg);
    }
    if (hdr->pg_hash != (kh_m_s2i_t *)0x0) {
      kh_destroy_m_s2i(hdr->pg_hash);
    }
    if (hdr->pg != (SAM_PG *)0x0) {
      for (local_1c = 0; local_1c < hdr->npg; local_1c = local_1c + 1) {
        if (hdr->pg[local_1c].name != (char *)0x0) {
          free(hdr->pg[local_1c].name);
        }
      }
      free(hdr->pg);
    }
    if (hdr->pg_end != (int *)0x0) {
      free(hdr->pg_end);
    }
    if (hdr->type_pool != (pool_alloc_t *)0x0) {
      pool_destroy(hdr->type_pool);
    }
    if (hdr->tag_pool != (pool_alloc_t *)0x0) {
      pool_destroy(hdr->tag_pool);
    }
    if (hdr->str_pool != (string_alloc_t *)0x0) {
      string_pool_destroy(hdr->str_pool);
    }
    free(hdr);
  }
  return;
}

Assistant:

void sam_hdr_free(SAM_hdr *hdr) {
    if (!hdr)
	return;

    if (--hdr->ref_count > 0)
	return;

    if (ks_str(&hdr->text))
	KS_FREE(&hdr->text);

    if (hdr->h)
	kh_destroy(sam_hdr, hdr->h);

    if (hdr->ref_hash)
	kh_destroy(m_s2i, hdr->ref_hash);

    if (hdr->ref) {
	int i;
	for (i = 0; i < hdr->nref; i++)
	    if (hdr->ref[i].name)
		free(hdr->ref[i].name);
	free(hdr->ref);
    }

    if (hdr->rg_hash)
	kh_destroy(m_s2i, hdr->rg_hash);

    if (hdr->rg) {
	int i;
	for (i = 0; i < hdr->nrg; i++)
	    if (hdr->rg[i].name)
		free(hdr->rg[i].name);
	free(hdr->rg);
    }

    if (hdr->pg_hash)
	kh_destroy(m_s2i, hdr->pg_hash);

    if (hdr->pg) {
	int i;
	for (i = 0; i < hdr->npg; i++)
	    if (hdr->pg[i].name)
		free(hdr->pg[i].name);
	free(hdr->pg);
    }

    if (hdr->pg_end)
	free(hdr->pg_end);

    if (hdr->type_pool)
	pool_destroy(hdr->type_pool);

    if (hdr->tag_pool)
	pool_destroy(hdr->tag_pool);

    if (hdr->str_pool)
	string_pool_destroy(hdr->str_pool);

    free(hdr);
}